

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

string * libcellml::formDescriptionOfCyclicDependency
                   (string *__return_storage_ptr__,History *history,string *action)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  NamedEntity *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  string *psVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong *puVar8;
  size_type *psVar9;
  char *pcVar10;
  pointer psVar11;
  undefined8 uVar12;
  ulong uVar13;
  long lVar14;
  string msgHistory;
  HistoryEpochPtr h;
  string typeStringPrefix;
  string msgHeader;
  ulong *local_1a8;
  long local_1a0;
  ulong local_198;
  long lStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string local_168;
  long *local_148;
  long local_140;
  long local_138;
  long lStack_130;
  long *local_128;
  long local_120;
  long local_118;
  long lStack_110;
  long *local_108;
  long local_100;
  long local_f8;
  long lStack_f0;
  long local_e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_e0;
  long *local_d8 [2];
  long local_c8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  long *local_98;
  long local_90;
  long local_88;
  long lStack_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar11 = (history->
            super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  peVar2 = (psVar11->super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  this = (psVar11->super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this->_M_use_count = this->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this->_M_use_count = this->_M_use_count + 1;
    }
  }
  this_00 = *(NamedEntity **)
             &(peVar2->mSourceModel).
              super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>;
  this_01._M_pi =
       ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&peVar2->mSourceModel + 8))->_M_pi;
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (this_01._M_pi)->_M_use_count = (this_01._M_pi)->_M_use_count + 1;
    }
  }
  local_58 = __return_storage_ptr__;
  iVar4 = std::__cxx11::string::compare((char *)&peVar2->mType);
  pcVar10 = "";
  if (iVar4 == 0) {
    pcVar10 = "a ";
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,pcVar10,pcVar10 + (ulong)(iVar4 == 0) * 2);
  std::operator+(&local_b8,"Cyclic dependencies were found when attempting to ",action);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_b8);
  local_148 = &local_138;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_138 = *plVar7;
    lStack_130 = plVar5[3];
  }
  else {
    local_138 = *plVar7;
    local_148 = (long *)*plVar5;
  }
  local_140 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_148,(ulong)local_d8[0]);
  local_128 = &local_118;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_118 = *plVar7;
    lStack_110 = plVar5[3];
  }
  else {
    local_118 = *plVar7;
    local_128 = (long *)*plVar5;
  }
  local_120 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_128,*(ulong *)&(peVar2->mType)._M_dataplus);
  local_108 = &local_f8;
  plVar7 = plVar5 + 2;
  if ((long *)*plVar5 == plVar7) {
    local_f8 = *plVar7;
    lStack_f0 = plVar5[3];
  }
  else {
    local_f8 = *plVar7;
    local_108 = (long *)*plVar5;
  }
  local_100 = plVar5[1];
  *plVar5 = (long)plVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_1a8 = &local_198;
  puVar8 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar8) {
    local_198 = *puVar8;
    lStack_190 = plVar5[3];
  }
  else {
    local_198 = *puVar8;
    local_1a8 = (ulong *)*plVar5;
  }
  local_1a0 = plVar5[1];
  *plVar5 = (long)puVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  NamedEntity::name_abi_cxx11_(&local_168,this_00);
  uVar13 = 0xf;
  if (local_1a8 != &local_198) {
    uVar13 = local_198;
  }
  if (uVar13 < local_168._M_string_length + local_1a0) {
    uVar12 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      uVar12 = local_168.field_2._M_allocated_capacity;
    }
    if (local_168._M_string_length + local_1a0 <= (ulong)uVar12) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_168,0,(char *)0x0,(ulong)local_1a8);
      goto LAB_0025e71a;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1a8,(ulong)local_168._M_dataplus._M_p);
LAB_0025e71a:
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  puVar8 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar8) {
    local_188.field_2._M_allocated_capacity = *puVar8;
    local_188.field_2._8_8_ = puVar6[3];
  }
  else {
    local_188.field_2._M_allocated_capacity = *puVar8;
    local_188._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_188._M_string_length = puVar6[1];
  *puVar6 = puVar8;
  puVar6[1] = 0;
  *(undefined1 *)puVar8 = 0;
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_78.field_2._M_allocated_capacity = *psVar9;
    local_78.field_2._8_8_ = plVar5[3];
  }
  else {
    local_78.field_2._M_allocated_capacity = *psVar9;
    local_78._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_78._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if (local_1a8 != &local_198) {
    operator_delete(local_1a8,local_198 + 1);
  }
  if (local_108 != &local_f8) {
    operator_delete(local_108,local_f8 + 1);
  }
  if (local_128 != &local_118) {
    operator_delete(local_128,local_118 + 1);
  }
  if (local_148 != &local_138) {
    operator_delete(local_148,local_138 + 1);
  }
  paVar1 = &local_b8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_e8 = 0;
  _Stack_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_allocated_capacity =
       local_188.field_2._M_allocated_capacity & 0xffffffffffffff00;
  psVar11 = (history->
            super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if ((history->
      super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != psVar11) {
    lVar14 = 8;
    uVar13 = 0;
    do {
      local_e8 = *(long *)((long)psVar11 + lVar14 + -8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_e0,
                 (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&(psVar11->
                         super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr + lVar14));
      std::operator+(&local_50," - ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_e8 + 0xa0));
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
      local_98 = &local_88;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_88 = *plVar7;
        lStack_80 = plVar5[3];
      }
      else {
        local_88 = *plVar7;
        local_98 = (long *)*plVar5;
      }
      local_90 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_98,*(ulong *)(local_e8 + 0x40));
      local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar8) {
        local_168.field_2._M_allocated_capacity = *puVar8;
        local_168.field_2._8_8_ = plVar5[3];
      }
      else {
        local_168.field_2._M_allocated_capacity = *puVar8;
        local_168._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_168._M_string_length = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_168);
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8.field_2._8_8_ = plVar5[3];
        local_b8._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_b8.field_2._M_allocated_capacity = *psVar9;
        local_b8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_b8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_b8,*(ulong *)(local_e8 + 0x80));
      local_148 = &local_138;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_138 = *plVar7;
        lStack_130 = plVar5[3];
      }
      else {
        local_138 = *plVar7;
        local_148 = (long *)*plVar5;
      }
      local_140 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_148);
      local_128 = &local_118;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_118 = *plVar7;
        lStack_110 = plVar5[3];
      }
      else {
        local_118 = *plVar7;
        local_128 = (long *)*plVar5;
      }
      local_120 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_128,*(ulong *)(local_e8 + 0x10));
      local_108 = &local_f8;
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_f8 = *plVar7;
        lStack_f0 = plVar5[3];
      }
      else {
        local_f8 = *plVar7;
        local_108 = (long *)*plVar5;
      }
      local_100 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
      local_1a8 = &local_198;
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_198 = *puVar8;
        lStack_190 = plVar5[3];
      }
      else {
        local_198 = *puVar8;
        local_1a8 = (ulong *)*plVar5;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_188,(ulong)local_1a8);
      if (local_1a8 != &local_198) {
        operator_delete(local_1a8,local_198 + 1);
      }
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if (local_128 != &local_118) {
        operator_delete(local_128,local_118 + 1);
      }
      if (local_148 != &local_138) {
        operator_delete(local_148,local_138 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_168._M_dataplus._M_p != &local_168.field_2) {
        operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      }
      if (local_98 != &local_88) {
        operator_delete(local_98,local_88 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::append((char *)&local_188);
      uVar13 = uVar13 + 1;
      psVar11 = (history->
                super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      lVar14 = lVar14 + 0x10;
    } while (uVar13 < (ulong)((long)(history->
                                    super__Vector_base<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)psVar11 >> 4
                             ));
  }
  psVar3 = local_58;
  std::operator+(local_58,&local_78,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if (_Stack_e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_e0._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  return psVar3;
}

Assistant:

std::string formDescriptionOfCyclicDependency(const History &history, const std::string &action)
{
    auto origin = history.front();
    auto model = origin->mSourceModel;
    bool isComponent = origin->mType == "component";
    std::string typeStringPrefix = isComponent ? "a " : "";
    std::string msgHeader = "Cyclic dependencies were found when attempting to " + action + " "
                            + typeStringPrefix + origin->mType + " in the model '"
                            + model->name() + "'. The dependency loop is:\n";
    HistoryEpochPtr h;
    size_t i = 0;
    std::string msgHistory;
    while (i < history.size()) {
        h = history[i];
        msgHistory += " - " + h->mType + " '" + h->mName + "' specifies an import from '" + h->mSourceUrl + "' to '" + h->mDestinationUrl + "'";
        if (i == history.size() - 2) {
            msgHistory += "; and\n";
        } else if (i == history.size() - 1) {
            msgHistory += ".";
        } else {
            msgHistory += ";\n";
        }
        ++i;
    }

    return msgHeader + msgHistory;
}